

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::destroySurfaces(MakeCurrentPerfCase *this)

{
  iterator iVar1;
  bool bVar2;
  deUint32 err;
  deBool dVar3;
  Library *pLVar4;
  size_type sVar5;
  reference ppvVar6;
  reference ppNVar7;
  reference ppNVar8;
  __normal_iterator<eglu::NativeWindow_**,_std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>_>
  local_50;
  __normal_iterator<eglu::NativeWindow_**,_std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>_>
  local_48;
  iterator iter_2;
  __normal_iterator<eglu::NativePixmap_**,_std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>_>
  local_38;
  iterator iter_1;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_28;
  iterator iter;
  EGLDisplay display;
  Library *egl;
  MakeCurrentPerfCase *this_local;
  
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_surfaces);
  if (sVar5 != 0) {
    iter._M_current = (void **)this->m_display;
    local_28._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_surfaces);
    while( true ) {
      iter_1._M_current =
           (NativePixmap **)std::vector<void_*,_std::allocator<void_*>_>::end(&this->m_surfaces);
      bVar2 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                          *)&iter_1);
      if (!bVar2) break;
      ppvVar6 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*(&local_28);
      if (*ppvVar6 != (void *)0x0) {
        do {
          iVar1._M_current = iter._M_current;
          ppvVar6 = __gnu_cxx::
                    __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
                    operator*(&local_28);
          (*pLVar4->_vptr_Library[0x16])(pLVar4,iVar1._M_current,*ppvVar6);
          err = (*pLVar4->_vptr_Library[0x1f])();
          eglu::checkError(err,"destroySurface(display, *iter)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                           ,0x156);
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
      }
      ppvVar6 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*(&local_28);
      *ppvVar6 = (void *)0x0;
      __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator++(&local_28);
    }
    std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_surfaces);
    local_38._M_current =
         (NativePixmap **)
         std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::begin
                   (&this->m_pixmaps);
    while( true ) {
      iter_2._M_current =
           (NativeWindow **)
           std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::end
                     (&this->m_pixmaps);
      bVar2 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<eglu::NativePixmap_**,_std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>_>
                          *)&iter_2);
      if (!bVar2) break;
      ppNVar7 = __gnu_cxx::
                __normal_iterator<eglu::NativePixmap_**,_std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>_>
                ::operator*(&local_38);
      if (*ppNVar7 != (NativePixmap *)0x0) {
        (**(code **)(*(long *)*ppNVar7 + 8))();
      }
      ppNVar7 = __gnu_cxx::
                __normal_iterator<eglu::NativePixmap_**,_std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>_>
                ::operator*(&local_38);
      *ppNVar7 = (NativePixmap *)0x0;
      __gnu_cxx::
      __normal_iterator<eglu::NativePixmap_**,_std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>_>
      ::operator++(&local_38);
    }
    std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::clear
              (&this->m_pixmaps);
    local_48._M_current =
         (NativeWindow **)
         std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::begin
                   (&this->m_windows);
    while( true ) {
      local_50._M_current =
           (NativeWindow **)
           std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::end
                     (&this->m_windows);
      bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar2) break;
      ppNVar8 = __gnu_cxx::
                __normal_iterator<eglu::NativeWindow_**,_std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>_>
                ::operator*(&local_48);
      if (*ppNVar8 != (NativeWindow *)0x0) {
        (*(*ppNVar8)->_vptr_NativeWindow[1])();
      }
      ppNVar8 = __gnu_cxx::
                __normal_iterator<eglu::NativeWindow_**,_std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>_>
                ::operator*(&local_48);
      *ppNVar8 = (NativeWindow *)0x0;
      __gnu_cxx::
      __normal_iterator<eglu::NativeWindow_**,_std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>_>
      ::operator++(&local_48);
    }
    std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::clear
              (&this->m_windows);
    std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_surfaces);
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::destroySurfaces (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	if (m_surfaces.size() > 0)
	{
		EGLDisplay display = m_display;

		// Destroy surfaces
		for (vector<EGLSurface>::iterator iter = m_surfaces.begin(); iter != m_surfaces.end(); ++iter)
		{
			if (*iter != EGL_NO_SURFACE)
				EGLU_CHECK_CALL(egl, destroySurface(display, *iter));
			*iter = EGL_NO_SURFACE;
		}

		m_surfaces.clear();

		// Destroy pixmaps
		for (vector<eglu::NativePixmap*>::iterator iter = m_pixmaps.begin(); iter != m_pixmaps.end(); ++iter)
		{
			delete *iter;
			*iter = NULL;
		}

		m_pixmaps.clear();

		// Destroy windows
		for (vector<eglu::NativeWindow*>::iterator iter = m_windows.begin(); iter != m_windows.end(); ++iter)
		{
			delete *iter;
			*iter = NULL;
		}

		m_windows.clear();

		// Clear all surface handles
		m_surfaces.clear();
	}
}